

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int try_lift(monst *mtmp,trap *ttmp,int wt,boolean stuff)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int wc;
  boolean stuff_local;
  int wt_local;
  trap *ttmp_local;
  monst *mtmp_local;
  
  iVar1 = weight_cap();
  if ((wt << 1) / iVar1 < 3) {
    mtmp_local._4_4_ = 1;
  }
  else {
    pcVar2 = Monnam(mtmp);
    pcVar3 = "too heavy";
    if (stuff != '\0') {
      pcVar3 = "carrying too much";
    }
    pline("%s is %s for you to lift.",pcVar2,pcVar3);
    if ((((-1 < (char)ttmp->field_0x8) && ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)) &&
        ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0)) &&
       (((mtmp->data->mflags1 & 0x10000) == 0 && (mtmp->data->mlet != '5')))) {
      iVar1 = rnl(10);
      if (iVar1 < 3) {
        *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | 0x400000;
        set_malign(mtmp);
        pcVar2 = Monnam(mtmp);
        pline("%s thinks it was nice of you to try.",pcVar2);
      }
    }
    mtmp_local._4_4_ = 0;
  }
  return mtmp_local._4_4_;
}

Assistant:

static int try_lift(struct monst *mtmp, struct trap *ttmp, int wt, boolean stuff)
{
	int wc = weight_cap();

	if (((wt * 2) / wc) >= HVY_ENCUMBER) {
	    pline("%s is %s for you to lift.", Monnam(mtmp),
		  stuff ? "carrying too much" : "too heavy");
	    if (!ttmp->madeby_u && !mtmp->mpeaceful && mtmp->mcanmove &&
		    !mindless(mtmp->data) &&
		    mtmp->data->mlet != S_HUMAN && rnl(10) < 3) {
		mtmp->mpeaceful = 1;
		set_malign(mtmp);		/* reset alignment */
		pline("%s thinks it was nice of you to try.", Monnam(mtmp));
	    }
	    return 0;
	}
	return 1;
}